

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  undefined8 uVar1;
  uint uVar2;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar keydata [112];
  secp256k1_scalar msg;
  secp256k1_rfc6979_hmac_sha256 local_118;
  undefined8 local_c8 [4];
  uchar local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  secp256k1_scalar local_50;
  
  secp256k1_scalar_set_b32(&local_50,msg32,(int *)0x0);
  secp256k1_scalar_get_b32(local_a8,&local_50);
  local_c8[0] = *(undefined8 *)key32;
  local_c8[1] = *(undefined8 *)(key32 + 8);
  local_c8[2] = *(undefined8 *)(key32 + 0x10);
  local_c8[3] = *(undefined8 *)(key32 + 0x18);
  if (data == (void *)0x0) {
    uVar2 = 0x40;
  }
  else {
    local_88 = *data;
    uStack_80 = *(undefined8 *)((long)data + 8);
    local_78 = *(undefined8 *)((long)data + 0x10);
    uStack_70 = *(undefined8 *)((long)data + 0x18);
    uVar2 = 0x60;
  }
  if (algo16 != (uchar *)0x0) {
    uVar1 = *(undefined8 *)(algo16 + 8);
    *(undefined8 *)((long)local_c8 + (ulong)uVar2) = *(undefined8 *)algo16;
    *(undefined8 *)((long)local_c8 + (ulong)uVar2 + 8) = uVar1;
    uVar2 = uVar2 | 0x10;
  }
  secp256k1_rfc6979_hmac_sha256_initialize(&local_118,(uchar *)local_c8,(ulong)uVar2);
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  uVar2 = 0;
  outlen = extraout_RDX;
  do {
    secp256k1_rfc6979_hmac_sha256_generate(&local_118,nonce32,outlen);
    uVar2 = uVar2 + 1;
    outlen = extraout_RDX_00;
  } while (uVar2 <= counter);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   secp256k1_scalar msg;
   unsigned char msgmod32[32];
   secp256k1_scalar_set_b32(&msg, msg32, NULL);
   secp256k1_scalar_get_b32(msgmod32, &msg);
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and reduced message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msgmod32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}